

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeRoundItem.h
# Opt level: O0

void __thiscall TimeRoundItem<channel>::~TimeRoundItem(TimeRoundItem<channel> *this)

{
  bool bVar1;
  TimeRoundItem<channel> *this_local;
  
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->ptr);
  if ((bVar1) && (bVar1 = std::function::operator_cast_to_bool((function *)&this->fun), bVar1)) {
    std::function<void_()>::operator()(&this->fun);
  }
  std::shared_ptr<channel>::~shared_ptr(&this->ptr);
  std::function<void_()>::~function(&this->fun);
  return;
}

Assistant:

~TimeRoundItem()
        {
            if(ptr && fun)
            {
                fun();
            }
        }